

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O3

Status * google::protobuf::util::converter::anon_unknown_8::WriteFixed64
                   (Status *__return_storage_ptr__,int field_number,DataPiece *data,
                   CodedOutputStream *stream)

{
  Status *extraout_RAX;
  Status *pSVar1;
  undefined1 local_58 [8];
  StatusOr<unsigned_long> u64;
  
  DataPiece::ToUint64((StatusOr<unsigned_long> *)local_58,data);
  if (local_58._0_4_ == OK) {
    protobuf::internal::WireFormatLite::WriteFixed64
              (field_number,u64.status_.error_message_.field_2._8_8_,stream);
  }
  Status::Status(__return_storage_ptr__,(Status *)local_58);
  pSVar1 = (Status *)&u64.status_.error_message_._M_string_length;
  if ((Status *)u64.status_._0_8_ != pSVar1) {
    operator_delete((void *)u64.status_._0_8_);
    pSVar1 = extraout_RAX;
  }
  return pSVar1;
}

Assistant:

inline Status WriteFixed64(int field_number, const DataPiece& data,
                           CodedOutputStream* stream) {
  StatusOr<uint64> u64 = data.ToUint64();
  if (u64.ok()) {
    WireFormatLite::WriteFixed64(field_number, u64.value(), stream);
  }
  return u64.status();
}